

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O2

int QTestResult::verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  char *__format;
  char *pcVar3;
  long in_FS_OFFSET;
  char msg [4096];
  char local_1038 [4096];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (sig == (uchar *)0x0) {
    qt_assert("statementStr",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestresult.cpp"
              ,0x12f);
  }
  bVar1 = SUB81(ctx,0);
  local_1038[0] = '\0';
  iVar2 = QTestLog::verboseLevel();
  if (1 < iVar2) {
    snprintf(local_1038,0x1000,"QVERIFY(%s)",sig);
    QTestLog::info(local_1038,(char *)tbs,(int)tbslen);
  }
  if ((QTest::expectFailMode == 0) != bVar1) {
    __format = "\'%s\' returned FALSE. (%s)";
    if (bVar1 != false) {
      __format = "\'%s\' returned TRUE unexpectedly. (%s)";
    }
    pcVar3 = "";
    if (siglen != 0) {
      pcVar3 = (char *)siglen;
    }
    snprintf(local_1038,0x1000,__format,sig,pcVar3);
  }
  bVar1 = checkStatement(bVar1,local_1038,(char *)tbs,(int)tbslen);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)CONCAT71(extraout_var,bVar1);
  }
  __stack_chk_fail();
}

Assistant:

bool QTestResult::verify(bool statement, const char *statementStr,
                         const char *description, const char *file, int line)
{
    QTEST_ASSERT(statementStr);

    Q_DECL_UNINITIALIZED char msg[maxMsgLen];
    msg[0] = '\0';

    if (QTestLog::verboseLevel() >= 2) {
        std::snprintf(msg, maxMsgLen, "QVERIFY(%s)", statementStr);
        QTestLog::info(msg, file, line);
    }

    if (statement == !!QTest::expectFailMode) {
        std::snprintf(msg, maxMsgLen,
                      statement ? "'%s' returned TRUE unexpectedly. (%s)" : "'%s' returned FALSE. (%s)",
                      statementStr, description ? description : "");
    }

    return checkStatement(statement, msg, file, line);
}